

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O2

double __thiscall IF97::Region3::speed_sound(Region3 *this,double T,double rho)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = delta_dphi_ddelta(this,T,rho);
  dVar2 = delta2_d2phi_ddelta2(this,T,rho);
  dVar3 = delta_dphi_ddelta(this,T,rho);
  dVar4 = deltatau_d2phi_ddelta_dtau(this,T,rho);
  dVar3 = powi(dVar3 - dVar4,2);
  dVar4 = tau2_d2phi_dtau2(this,T,rho);
  dVar1 = this->R * 1000.0 * T * ((dVar1 + dVar1 + dVar2) - dVar3 / dVar4);
  if (0.0 <= dVar1) {
    return SQRT(dVar1);
  }
  dVar1 = sqrt(dVar1);
  return dVar1;
}

Assistant:

double speed_sound(double T, double rho) const{
            const double RHS = 2*delta_dphi_ddelta(T, rho) + delta2_d2phi_ddelta2(T, rho)-powi(delta_dphi_ddelta(T,rho)-deltatau_d2phi_ddelta_dtau(T,rho),2)/tau2_d2phi_dtau2(T,rho);
            return sqrt(R*(1000/R_fact)*T*RHS);
        }